

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void celero::executor::RunAllExperiments(void)

{
  TestVector *pTVar1;
  size_t sVar2;
  ulong uVar3;
  shared_ptr<celero::Benchmark> bmark;
  __shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  uVar3 = 0;
  while( true ) {
    pTVar1 = TestVector::Instance();
    sVar2 = TestVector::size(pTVar1);
    if (sVar2 <= uVar3) break;
    pTVar1 = TestVector::Instance();
    TestVector::operator[]((TestVector *)&local_48,(size_t)pTVar1);
    if (local_48._M_ptr != (element_type *)0x0) {
      std::__shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_38,&local_48);
      RunExperiments((shared_ptr<celero::Benchmark> *)&local_38);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void executor::RunAllExperiments()
{
	// Run through all the tests in ascending order.
	for(size_t i = 0; i < celero::TestVector::Instance().size(); i++)
	{
		auto bmark = celero::TestVector::Instance()[i];
		if(bmark != nullptr)
		{
			executor::RunExperiments(bmark);
		}
	}
}